

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,LimitToken *old_limit)

{
  char *local_28;
  int local_1c;
  
  local_28 = ptr;
  ReadSize(&local_28);
  if ((local_28 == (char *)0x0) || (this->depth_ < 1)) {
    local_28 = (char *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffe4,(char *)this,(int)local_28);
    old_limit->token_ = local_1c;
    this->depth_ = this->depth_ + -1;
  }
  return local_28;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       LimitToken* old_limit) {
  return ReadSizeAndPushLimitAndDepthInlined(ptr, old_limit);
}